

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynhds.c
# Opt level: O0

dynhds_entry * Curl_dynhds_get(dynhds *dynhds,char *name,size_t namelen)

{
  int iVar1;
  ulong local_30;
  size_t i;
  size_t namelen_local;
  char *name_local;
  dynhds *dynhds_local;
  
  local_30 = 0;
  while( true ) {
    if (dynhds->hds_len <= local_30) {
      return (dynhds_entry *)0x0;
    }
    if ((dynhds->hds[local_30]->namelen == namelen) &&
       (iVar1 = curl_strnequal(dynhds->hds[local_30]->name,name,namelen), iVar1 != 0)) break;
    local_30 = local_30 + 1;
  }
  return dynhds->hds[local_30];
}

Assistant:

struct dynhds_entry *Curl_dynhds_get(struct dynhds *dynhds, const char *name,
                                     size_t namelen)
{
  size_t i;
  for(i = 0; i < dynhds->hds_len; ++i) {
    if(dynhds->hds[i]->namelen == namelen &&
       strncasecompare(dynhds->hds[i]->name, name, namelen)) {
      return dynhds->hds[i];
    }
  }
  return NULL;
}